

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::detail::formatTruncated<std::__cxx11::string>
               (ostream *out,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,int ntrunc)

{
  long in_FS_OFFSET;
  string result;
  ostringstream tmp;
  long local_1c0 [4];
  ostringstream local_1a0 [376];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(string *)value);
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)out,local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}